

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidget::setDateRange(QCalendarWidget *this,QDate min,QDate max)

{
  bool bVar1;
  QCalendarWidgetPrivate *pQVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  QCalendarWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QCalendarWidgetPrivate *d;
  QDate newDate;
  QDate oldDate;
  QCalendarModel *in_stack_ffffffffffffff68;
  QDate QVar3;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QDate in_stack_ffffffffffffff78;
  QSpinBox *pQVar4;
  QDate *in_stack_ffffffffffffff80;
  int minimum;
  QCalendarWidgetPrivate *this_00;
  QCalendarWidgetPrivate *this_01;
  qint64 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  qint64 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pQVar2 = d_func((QCalendarWidget *)0x51ff40);
  bVar1 = ::operator==((QDate *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (QDate *)in_stack_ffffffffffffff68);
  if (((!bVar1) ||
      (bVar1 = ::operator==((QDate *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (QDate *)in_stack_ffffffffffffff68), !bVar1)) &&
     (bVar1 = QDate::isValid(in_stack_ffffffffffffff80), bVar1)) {
    bVar1 = QDate::isValid(in_stack_ffffffffffffff80);
    minimum = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    if (bVar1) {
      local_20 = (pQVar2->m_model->m_date).jd;
      local_28 = local_10;
      local_30 = local_18;
      QVar3.jd._4_4_ = in_stack_ffffffffffffff74;
      QVar3.jd._0_4_ = in_stack_ffffffffffffff70;
      QtPrivate::QCalendarModel::setRange(in_stack_ffffffffffffff68,in_stack_ffffffffffffff78,QVar3)
      ;
      pQVar4 = pQVar2->yearEdit;
      local_38 = *(undefined8 *)&pQVar2->m_model->m_calendar;
      QDate::year(&pQVar2->m_model->m_minimumDate,local_38);
      QSpinBox::setMinimum((QSpinBox *)in_RDI,minimum);
      this_00 = (QCalendarWidgetPrivate *)pQVar2->yearEdit;
      local_40 = *(undefined8 *)&pQVar2->m_model->m_calendar;
      QDate::year(&pQVar2->m_model->m_maximumDate,local_40);
      QSpinBox::setMaximum((QSpinBox *)in_RDI,(int)((ulong)this_00 >> 0x20));
      QCalendarWidgetPrivate::updateMonthMenu(this_01);
      local_48 = (pQVar2->m_model->m_date).jd;
      bVar1 = ::operator!=((QDate *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (QDate *)in_stack_ffffffffffffff68);
      if (bVar1) {
        QCalendarWidgetPrivate::update(this_00);
        QVar3.jd = (qint64)pQVar2;
        QDate::year(&local_48,*(undefined8 *)&pQVar2->m_model->m_calendar);
        QDate::month(&local_48,*(undefined8 *)&pQVar2->m_model->m_calendar);
        QCalendarWidgetPrivate::showMonth(this_00,(int)((ulong)pQVar4 >> 0x20),(int)pQVar4);
        QtPrivate::QCalendarTextNavigator::setDate((QCalendarTextNavigator *)0x520178,QVar3);
        selectionChanged((QCalendarWidget *)0x520182);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarWidget::setDateRange(QDate min, QDate max)
{
    Q_D(QCalendarWidget);
    if (d->m_model->m_minimumDate == min && d->m_model->m_maximumDate == max)
        return;
    if (!min.isValid() || !max.isValid())
        return;

    QDate oldDate = d->m_model->m_date;
    d->m_model->setRange(min, max);
    d->yearEdit->setMinimum(d->m_model->m_minimumDate.year(d->m_model->m_calendar));
    d->yearEdit->setMaximum(d->m_model->m_maximumDate.year(d->m_model->m_calendar));
    d->updateMonthMenu();
    QDate newDate = d->m_model->m_date;
    if (oldDate != newDate) {
        d->update();
        d->showMonth(newDate.year(d->m_model->m_calendar), newDate.month(d->m_model->m_calendar));
        d->m_navigator->setDate(newDate);
        emit selectionChanged();
    }
}